

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool write_string_to_file(char *path,char *string)

{
  FILE *__stream;
  FILE *file;
  char *string_local;
  char *path_local;
  
  __stream = fopen(path,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s",string);
    fclose(__stream);
  }
  else {
    fprintf(_stderr,"Failed to write file: %s\n",path);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

static bool write_string_to_file(const char *path, const char *string)
{
	FILE *file = fopen(path, "w");
	if (!file)
	{
		fprintf(stderr, "Failed to write file: %s\n", path);
		return false;
	}

	fprintf(file, "%s", string);
	fclose(file);
	return true;
}